

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

void check_input<unsigned_int>(uchar **from0,lcp_t *lcp_input0,uint *cache_input0,size_t n0)

{
  byte *pbVar1;
  uchar *puVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  long lVar7;
  lcp_t lVar8;
  lcp_t in_R8;
  
  if (1 < n0) {
    sVar6 = 1;
    do {
      if (from0[sVar6 - 1] == (uchar *)0x0) goto LAB_001c7671;
      if (from0[sVar6] == (uchar *)0x0) goto LAB_001c7690;
      sVar6 = sVar6 + 1;
    } while (n0 != sVar6);
  }
  if (1 < n0) {
    sVar6 = 1;
    do {
      if (from0[sVar6 - 1] == (uchar *)0x0) {
LAB_001c7671:
        __assert_fail("a != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
      }
      if (from0[sVar6] == (uchar *)0x0) {
LAB_001c7690:
        __assert_fail("b != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
      }
      iVar4 = strcmp((char *)from0[sVar6 - 1],(char *)from0[sVar6]);
      if (0 < iVar4) {
        __assert_fail("cmp(from0[i-1],from0[i])<=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x42f,
                      "void check_input(unsigned char **, lcp_t *, CharT *, size_t) [CharT = unsigned int]"
                     );
      }
      sVar6 = sVar6 + 1;
    } while (n0 != sVar6);
  }
  if (1 < n0) {
    sVar6 = 1;
    do {
      lVar7 = 0;
      lVar8 = 0;
      do {
        if ((from0[sVar6 - 1][lVar7] == '\0') || (from0[sVar6 - 1][lVar7] != from0[sVar6][lVar7])) {
          bVar3 = false;
          in_R8 = lVar8;
        }
        else {
          lVar8 = lVar8 + 1;
          bVar3 = true;
        }
        lVar7 = lVar7 + 1;
      } while (bVar3);
      if (in_R8 != lcp_input0[sVar6 - 1]) {
        __assert_fail("lcp(from0[i-1],from0[i])==lcp_input0[i-1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x430,
                      "void check_input(unsigned char **, lcp_t *, CharT *, size_t) [CharT = unsigned int]"
                     );
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 != n0);
  }
  pbVar1 = *from0;
  if (pbVar1 != (byte *)0x0) {
    if (*pbVar1 == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (uint)*pbVar1 << 0x18;
      if (pbVar1[1] != 0) {
        uVar5 = uVar5 | (uint)pbVar1[1] << 0x10;
        if (pbVar1[2] != 0) {
          uVar5 = uVar5 | CONCAT11(pbVar1[2],pbVar1[3]);
        }
      }
    }
    if (uVar5 != *cache_input0) {
      __assert_fail("get_char<CharT>(*from0,0)==cache_input0[0]",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x431,
                    "void check_input(unsigned char **, lcp_t *, CharT *, size_t) [CharT = unsigned int]"
                   );
    }
    if (1 < n0) {
      lVar7 = 0;
      do {
        puVar2 = from0[lVar7 + 1];
        if (puVar2 == (uchar *)0x0) goto LAB_001c76af;
        lVar8 = lcp_input0[lVar7];
        if (puVar2[lVar8] == 0) {
          uVar5 = 0;
        }
        else {
          uVar5 = (uint)puVar2[lVar8] << 0x18;
          if (puVar2[lVar8 + 1] != 0) {
            uVar5 = uVar5 | (uint)puVar2[lVar8 + 1] << 0x10;
            if (puVar2[lVar8 + 2] != '\0') {
              uVar5 = uVar5 | CONCAT11(puVar2[lVar8 + 2],puVar2[lVar8 + 3]);
            }
          }
        }
        if (uVar5 != cache_input0[lVar7 + 1]) {
          __assert_fail("get_char<CharT>(from0[i],lcp_input0[i-1]) ==cache_input0[i]",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x433,
                        "void check_input(unsigned char **, lcp_t *, CharT *, size_t) [CharT = unsigned int]"
                       );
        }
        lVar7 = lVar7 + 1;
      } while (n0 - 1 != lVar7);
    }
    return;
  }
LAB_001c76af:
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                ,0x38,"uint32_t get_char(unsigned char *, size_t)");
}

Assistant:

static void
check_input(unsigned char** from0, lcp_t* lcp_input0, CharT* cache_input0, size_t n0)
{
	(void) from0;
	(void) lcp_input0;
	(void) cache_input0;
	(void) n0;
#ifndef NDEBUG
	for(size_t i=1;i<n0;++i)if(cmp(from0[i-1],from0[i])>0){
		debug()<<"Oops: ''"<<from0[i-1]<<"'' > ''"<<from0[i]<<"''\n";}
	for(size_t i=1;i<n0;++i)if(lcp(from0[i-1],from0[i])!=lcp_input0[i-1]){
		debug()<<"Oops: "<<"lcp('"<<from0[i-1]<<"', '"<<from0[i]<<"')="
			<<lcp(from0[i-1],from0[i])<<" != "<<lcp_input0[i-1]<<"\n";}
	for(size_t i=1;i<n0;++i)assert(cmp(from0[i-1],from0[i])<=0);
	for(size_t i=1;i<n0;++i)assert(lcp(from0[i-1],from0[i])==lcp_input0[i-1]);
	assert(get_char<CharT>(*from0,0)==cache_input0[0]);
	for(size_t i=1;i<n0;++i)assert(get_char<CharT>(from0[i],lcp_input0[i-1])
			==cache_input0[i]);
#endif
}